

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mustache.cpp
# Opt level: O2

QVariantHash contactInfo(QString *name,QString *email)

{
  QVariant *pQVar1;
  QString *in_RDX;
  QArrayDataPointer<char16_t> local_50;
  QVariant local_38;
  
  (name->d).d = (Data *)0x0;
  QVariant::QVariant(&local_38,(QString *)email);
  QString::QString((QString *)&local_50,"name");
  pQVar1 = QHash<QString,_QVariant>::operator[]
                     ((QHash<QString,_QVariant> *)name,(QString *)&local_50);
  QVariant::operator=(pQVar1,&local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QVariant::~QVariant(&local_38);
  QVariant::QVariant(&local_38,in_RDX);
  QString::QString((QString *)&local_50,"email");
  pQVar1 = QHash<QString,_QVariant>::operator[]
                     ((QHash<QString,_QVariant> *)name,(QString *)&local_50);
  QVariant::operator=(pQVar1,&local_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  QVariant::~QVariant(&local_38);
  return (QVariantHash)(Data *)name;
}

Assistant:

QVariantHash contactInfo(const QString& name, const QString& email)
{
	QVariantHash map;
	map["name"] = name;
	map["email"] = email;
	return map;
}